

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O1

IConnection * __thiscall tonk::P2PConnectionKeyMap::FindByKey(P2PConnectionKeyMap *this,key_t key)

{
  atomic<int> *paVar1;
  raw_node *prVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  raw_node *prVar6;
  uint uVar7;
  uint uVar8;
  IConnection *pIVar9;
  bool bVar10;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->P2PKeyLock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if ((this->P2PKeyMap).TheMap.m_num_valid != 0) {
    uVar5 = key * -0x61c88647 >> ((byte)(this->P2PKeyMap).TheMap.m_hash_shift & 0x1f);
    prVar2 = (this->P2PKeyMap).TheMap.m_values;
    bVar3 = true;
    uVar7 = uVar5;
    if (prVar2[uVar5].m_bits[0x10] != '\0') {
      prVar6 = prVar2 + uVar5;
      if (*(key_t *)prVar6->m_bits == key) {
        bVar3 = false;
      }
      else {
        uVar8 = (this->P2PKeyMap).TheMap.m_values_count - 1;
        do {
          bVar10 = uVar7 == 0;
          prVar6 = prVar6 + -1;
          uVar7 = uVar7 - 1;
          if (bVar10) {
            prVar6 = prVar2 + uVar8;
            uVar7 = uVar8;
          }
          if ((uVar7 == uVar5) || (prVar6->m_bits[0x10] == '\0')) goto LAB_001515cc;
        } while (*(key_t *)prVar6->m_bits != key);
        bVar3 = false;
      }
    }
LAB_001515cc:
    if (!bVar3) goto LAB_001515d5;
  }
  uVar7 = 0xffffffff;
LAB_001515d5:
  if ((int)uVar7 < 0) {
    pIVar9 = (IConnection *)0x0;
  }
  else {
    pIVar9 = *(IConnection **)((this->P2PKeyMap).TheMap.m_values[uVar7].m_bits + 8);
  }
  if (pIVar9 != (IConnection *)0x0) {
    LOCK();
    paVar1 = &(pIVar9->SelfRefCount).RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->P2PKeyLock);
  return pIVar9;
}

Assistant:

IConnection* FindByKey(key_t key)
    {
        Locker locker(P2PKeyLock);
        IConnection* connection = P2PKeyMap.Find(key);
        if (connection) {
            connection->SelfRefCount.IncrementReferences();
        }
        return connection;
    }